

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(PropertySymOpnd *this,Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  byte local_19;
  Func *func_local;
  PropertySymOpnd *this_local;
  
  bVar1 = IsPoly(this);
  local_19 = 0;
  if ((bVar1) && (local_19 = 0, 0x7f < this->m_polyCacheUtil)) {
    sourceContextId = Func::GetSourceContextId(func);
    functionId = Func::GetLocalFunctionId(func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,PolyEquivTypeGuardPhase,sourceContextId,functionId);
    local_19 = bVar1 ^ 0xff;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool
PropertySymOpnd::ShouldUsePolyEquivTypeGuard(Func *const func) const
{
    return this->IsPoly() && this->m_polyCacheUtil >= PolymorphicInlineCacheUtilizationThreshold && !PHASE_OFF(Js::PolyEquivTypeGuardPhase, func);
}